

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

char * extract_dir_from_path(char *path)

{
  int iVar1;
  char *local_20;
  char *p;
  char *path_local;
  
  iVar1 = fl_filename_isdir(path);
  path_local = path;
  if (iVar1 == 0) {
    if (*path == '/') {
      if (extract_dir_from_path::dir != (char *)0x0) {
        free(extract_dir_from_path::dir);
      }
      extract_dir_from_path::dir = strdup(path);
      do {
        local_20 = strrchr(extract_dir_from_path::dir,0x2f);
        if (local_20 == extract_dir_from_path::dir) {
          local_20 = local_20 + 1;
        }
        *local_20 = '\0';
        iVar1 = fl_filename_isdir(extract_dir_from_path::dir);
      } while (iVar1 == 0);
      path_local = extract_dir_from_path::dir;
    }
    else {
      path_local = (char *)0x0;
    }
  }
  return path_local;
}

Assistant:

static char *extract_dir_from_path(const char *path)
{
  static char *dir = NULL;
  if (fl_filename_isdir(path)) {
    return (char*)path;
  }
  if (*path != '/') return NULL;
  if (dir) free(dir);
  dir = strdup(path);
  do {
    char *p = strrchr(dir, '/');
    if (p == dir) p++;
    *p = 0;
    }
  while (!fl_filename_isdir(dir));
  return dir;
}